

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_APIDestroy(hrgls_API api)

{
  API *this;
  hrgls_Status local_14;
  hrgls_Status s;
  hrgls_API api_local;
  
  local_14 = 0;
  if (api == (hrgls_API)0x0) {
    local_14 = 0x3ec;
  }
  else {
    if (api->api == (API *)0x0) {
      local_14 = 0x3ec;
    }
    else {
      this = api->api;
      if (this != (API *)0x0) {
        hrgls::API::~API(this);
        operator_delete(this);
      }
      api->api = (API *)0x0;
    }
    if (api != (hrgls_API)0x0) {
      hrgls_API_::~hrgls_API_(api);
      operator_delete(api);
    }
  }
  return local_14;
}

Assistant:

hrgls_Status hrgls_APIDestroy(hrgls_API api)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!api) {
      s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
    } else {
      if (!api->api) {
        s = hrgls_STATUS_DELETE_OF_NULL_POINTER;
      } else {

        try {
          delete api->api;
        } catch (...) {
          s = hrgls_STATUS_DELETION_FAILED;
        }
        api->api = nullptr;
      }
      try {
        delete api;
      } catch (...) {
        s = hrgls_STATUS_DELETION_FAILED;
      }
    }
    return s;
  }